

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

double duckdb::NoInfiniteDoubleWrapper<duckdb::ACos>::Operation<double,double>(double input)

{
  OutOfRangeException *this;
  bool bVar1;
  double dVar2;
  allocator local_41;
  double local_40;
  string local_38;
  
  local_40 = input;
  bVar1 = Value::IsFinite<double>(input);
  if (bVar1) {
    dVar2 = ACos::Operation<double,double>(local_40);
    return dVar2;
  }
  bVar1 = Value::IsNan<double>(local_40);
  if (bVar1) {
    return local_40;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"input value %lf is out of range for numeric function",&local_41);
  OutOfRangeException::OutOfRangeException<double>(this,&local_38,local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		if (DUCKDB_UNLIKELY(!Value::IsFinite(input))) {
			if (Value::IsNan(input)) {
				return input;
			}
			throw OutOfRangeException("input value %lf is out of range for numeric function", input);
		}
		return OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input);
	}